

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.lex.cc
# Opt level: O0

yy_state_type yy_try_NUL_trans(yy_state_type yy_current_state)

{
  int local_20;
  byte local_19;
  YY_CHAR yy_c;
  char *yy_cp;
  int yy_is_jam;
  yy_state_type yy_current_state_local;
  
  local_19 = 1;
  yy_cp._4_4_ = yy_current_state;
  if (yy_accept[yy_current_state] != 0) {
    yy_last_accepting_cpos = yy_c_buf_p;
    yy_last_accepting_state = yy_current_state;
  }
  while (yy_chk[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_19)] != yy_cp._4_4_) {
    yy_cp._4_4_ = (yy_state_type)yy_def[yy_cp._4_4_];
    if (0x56 < yy_cp._4_4_) {
      local_19 = ""[local_19];
    }
  }
  local_20 = (int)yy_nxt[(int)((int)yy_base[yy_cp._4_4_] + (uint)local_19)];
  if (local_20 == 0x56) {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

static yy_state_type yy_try_NUL_trans  (yy_state_type yy_current_state )
{
	int yy_is_jam;
    	char *yy_cp = (yy_c_buf_p);

	YY_CHAR yy_c = 1;
	if ( yy_accept[yy_current_state] )
		{
		(yy_last_accepting_state) = yy_current_state;
		(yy_last_accepting_cpos) = yy_cp;
		}
	while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
		{
		yy_current_state = (int) yy_def[yy_current_state];
		if ( yy_current_state >= 61 )
			yy_c = yy_meta[yy_c];
		}
	yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
	yy_is_jam = (yy_current_state == 60);

		return yy_is_jam ? 0 : yy_current_state;
}